

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void CalcTrainSum(char *buf,int start_line,int line_num,
                 vector<int,_std::allocator<int>_> *sum_label0,
                 vector<int,_std::allocator<int>_> *sum_label1,short *cnt_label0,short *cnt_label1)

{
  char cVar1;
  char *pcVar2;
  reference pvVar3;
  int local_40;
  int local_3c;
  int ret;
  int f_cnt;
  int label;
  int cnt;
  short *cnt_label0_local;
  vector<int,_std::allocator<int>_> *sum_label1_local;
  vector<int,_std::allocator<int>_> *sum_label0_local;
  int line_num_local;
  int start_line_local;
  char *buf_local;
  
  for (_line_num_local = buf + (start_line + line_num) * 0x17a2; *_line_num_local != '\n';
      _line_num_local = _line_num_local + 1) {
  }
  f_cnt = 0;
  while (f_cnt < line_num) {
    cVar1 = _line_num_local[-1];
    _line_num_local = _line_num_local + -2;
    local_3c = features_num;
    while (local_3c = local_3c + -1, -1 < local_3c) {
      local_40 = (_line_num_local[-3] + -0x30) * 100;
      pcVar2 = _line_num_local + -6;
      if (_line_num_local[-6] == '-') {
        local_40 = (_line_num_local[-3] + -0x30) * -100;
        pcVar2 = _line_num_local + -7;
      }
      _line_num_local = pcVar2;
      if (cVar1 == '0') {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](sum_label0,(long)local_3c);
        *pvVar3 = local_40 + *pvVar3;
      }
      else {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](sum_label1,(long)local_3c);
        *pvVar3 = local_40 + *pvVar3;
      }
    }
    f_cnt = f_cnt + 1;
    if (cVar1 == '0') {
      *cnt_label0 = *cnt_label0 + 1;
    }
    else {
      *cnt_label1 = *cnt_label1 + 1;
    }
  }
  return;
}

Assistant:

void CalcTrainSum (char * buf, int start_line, int line_num, vector<int> & sum_label0, vector<int> & sum_label1, short & cnt_label0, short & cnt_label1) {

    buf += (start_line + line_num) * 6050; // 假设每行6050个字节，得到该块最后一行的中间某个位置
    while (*buf != '\n') buf++; // 跳到该块最后一个字符就，即该块最后一个换行符的位置


    // 开始倒着读取
    int cnt = 0;
    while (cnt < line_num) {

        buf--; // 跳过换行符，来到该行最后一个label的位置
        int label = *buf - '0';
        buf--; // 来到逗号的位置

        int f_cnt = features_num - 1;
        while (f_cnt >= 0) {

            buf -= 1; // 跳过逗号的位置

            int ret = 100 * (*(buf - 2) - '0');

            buf -= 5; // 跳过浮点数的部分，来到逗号或者符号位的位置。如果是该行第一个数，则会来到上一行的换行符位置
            if (*buf == '-') {ret = -ret;buf--;} // 负数需要取反，并多移动一位

            if (label == 0) {
                sum_label0[f_cnt] += ret;
            } else {
                sum_label1[f_cnt] += ret;
            }
            f_cnt--;

        }

        cnt++;
        if (label == 0) {
            cnt_label0++;
        } else {
            cnt_label1++;
        }
    }
}